

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::splittetrahedron
          (tetgenmesh *this,triface *splittet,int qflag,double *ccent,int chkencflag)

{
  undefined8 rrp;
  point *p1;
  uint uVar1;
  int iVar2;
  point pdVar3;
  face *pfVar4;
  undefined1 local_1b8 [8];
  flipconstraints fc;
  double r;
  double fcent [3];
  locateresult sloc;
  double prjpt [3];
  undefined1 local_f8 [8];
  face searchsh;
  double rv;
  int i;
  int splitflag;
  insertvertexflags ivf;
  badface *bface;
  point *ppt;
  point newpt;
  face *paryseg;
  triface searchtet;
  int chkencflag_local;
  double *ccent_local;
  int qflag_local;
  triface *splittet_local;
  tetgenmesh *this_local;
  
  searchtet._12_4_ = chkencflag;
  triface::triface((triface *)&paryseg);
  insertvertexflags::insertvertexflags((insertvertexflags *)&i);
  rv._4_4_ = 0;
  searchsh.shver = 0;
  searchsh._12_4_ = 0;
  makepoint(this,(point *)&ppt,FREEVOLVERTEX);
  p1 = ppt;
  for (rv._0_4_ = 0; (int)rv._0_4_ < 3; rv._0_4_ = rv._0_4_ + 1) {
    ppt[(int)rv._0_4_] = (point)ccent[(int)rv._0_4_];
  }
  if (this->useinsertradius != 0) {
    pdVar3 = org(this,splittet);
    searchsh._8_8_ = distance(this,(double *)p1,pdVar3);
    setpointinsradius(this,(point)ppt,(double)searchsh._8_8_);
  }
  triface::operator=((triface *)&paryseg,splittet);
  i = 1;
  i = locate(this,(point)ppt,(triface *)&paryseg,1);
  if ((i == OUTSIDE) || (i == ENCSUBFACE)) {
    if (2 < this->b->verbose) {
      uVar1 = pointmark(this,(point)ppt);
      printf("    New point %d is blocked by a polygon.\n",(ulong)uVar1);
    }
    pointdealloc(this,(point)ppt);
    if (this->b->nobisect == 0) {
      face::face((face *)local_f8);
      fcent[2]._4_4_ = 1;
      tspivot(this,(triface *)&paryseg,(face *)local_f8);
      projpt2face(this,ccent,(double *)*(shellface *)((long)local_f8 + 0x18),
                  (double *)*(shellface *)((long)local_f8 + 0x20),
                  (double *)*(shellface *)((long)local_f8 + 0x28),(double *)&stack0xfffffffffffffee8
                 );
      fcent[2]._4_4_ = slocate(this,(point)&stack0xfffffffffffffee8,(face *)local_f8,0,0,1);
      if ((fcent[2]._4_4_ == ONEDGE) || (fcent[2]._4_4_ == ONFACE)) {
        fc.remvert = (point)0x0;
        iVar2 = checkfac4encroach(this,(point)*(shellface *)((long)local_f8 + 0x18),
                                  (point)*(shellface *)((long)local_f8 + 0x20),
                                  (point)*(shellface *)((long)local_f8 + 0x28),ccent,&r,
                                  (double *)&fc.remvert);
        if (iVar2 != 0) {
          pdVar3 = org(this,splittet);
          rv._4_4_ = splitsubface(this,(face *)local_f8,(point)0x0,pdVar3,qflag,&r,
                                  searchtet._12_4_ | 2);
          if (rv._4_4_ != 0) {
            repairencfacs(this,searchtet._12_4_ | 2);
          }
        }
      }
      if (((rv._4_4_ != 0) && (splittet->tet != (tetrahedron *)0x0)) &&
         (splittet->tet[4] != (tetrahedron)0x0)) {
        enqueuetetrahedron(this,splittet);
      }
      this_local._4_4_ = rv._4_4_;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    splitflag = 3;
    ivf.iloc = 2;
    ivf.validflag = 3;
    if (this->b->metric != 0) {
      ivf.validflag = 7;
    }
    ivf.respectbdflag = searchtet._12_4_;
    ivf.assignmeshsize = 0;
    ivf.cdtflag = 0;
    ivf.bowywat = 0;
    ivf.lawson = 1;
    ivf.splitbdflag = 1;
    ivf.chkencflag = this->b->metric;
    ivf.sloc = 1;
    triface::operator=((triface *)&ivf.refineflag,splittet);
    iVar2 = insertpoint(this,(point)ppt,(triface *)&paryseg,(face *)0x0,(face *)0x0,
                        (insertvertexflags *)&i);
    if (iVar2 == 0) {
      pointdealloc(this,(point)ppt);
      if (i == 7) {
        if ((this->b->nobisect == 0) || (this->checkconstraints != 0)) {
          for (rv._0_4_ = 0; rrp = searchsh._8_8_, (long)(int)rv._0_4_ < this->encseglist->objects;
              rv._0_4_ = rv._0_4_ + 1) {
            pfVar4 = (face *)(this->encseglist->toparray
                              [(int)rv._0_4_ >> ((byte)this->encseglist->log2objectsperblock & 0x1f)
                              ] + (int)((rv._0_4_ & this->encseglist->objectsperblockmark) *
                                       this->encseglist->objectbytes));
            newpt = (point)pfVar4;
            pdVar3 = org(this,splittet);
            iVar2 = splitsegment(this,pfVar4,(point)0x0,(double)rrp,pdVar3,(point)0x0,qflag,
                                 searchtet._12_4_ | 3);
            if (iVar2 != 0) {
              rv._4_4_ = 1;
              break;
            }
          }
        }
        arraypool::restart(this->encseglist);
        if (rv._4_4_ != 0) {
          if (0 < this->badsubsegs->items) {
            repairencsegs(this,searchtet._12_4_ | 3);
          }
          if (0 < this->badsubfacs->items) {
            repairencfacs(this,searchtet._12_4_ | 2);
          }
        }
      }
      else if (i == 8) {
        if ((this->b->nobisect == 0) || (this->checkconstraints != 0)) {
          for (rv._0_4_ = 0; (long)(int)rv._0_4_ < this->encshlist->objects; rv._0_4_ = rv._0_4_ + 1
              ) {
            ivf.parentpt = (point)(this->encshlist->toparray
                                   [(int)rv._0_4_ >>
                                    ((byte)this->encshlist->log2objectsperblock & 0x1f)] +
                                  (int)((rv._0_4_ & this->encshlist->objectsperblockmark) *
                                       this->encshlist->objectbytes));
            pfVar4 = (face *)(ivf.parentpt + 2);
            pdVar3 = org(this,splittet);
            iVar2 = splitsubface(this,pfVar4,(point)0x0,pdVar3,qflag,ivf.parentpt + 5,
                                 searchtet._12_4_ | 2);
            if (iVar2 != 0) {
              rv._4_4_ = 1;
              break;
            }
          }
        }
        arraypool::restart(this->encshlist);
        if ((rv._4_4_ != 0) && (0 < this->badsubfacs->items)) {
          repairencfacs(this,searchtet._12_4_ | 2);
        }
      }
      else if (i == 9) {
        terminatetetgen(this,2);
      }
      if (((rv._4_4_ != 0) && (splittet->tet != (tetrahedron *)0x0)) &&
         (splittet->tet[4] != (tetrahedron)0x0)) {
        enqueuetetrahedron(this,splittet);
      }
      this_local._4_4_ = rv._4_4_;
    }
    else {
      this->st_volref_count = this->st_volref_count + 1;
      if (0 < this->steinerleft) {
        this->steinerleft = this->steinerleft + -1;
      }
      if (this->flipstack != (badface *)0x0) {
        flipconstraints::flipconstraints((flipconstraints *)local_1b8);
        local_1b8._4_4_ = searchtet._12_4_;
        local_1b8._0_4_ = 2;
        lawsonflip3d(this,(flipconstraints *)local_1b8);
        arraypool::restart(this->unflipqueue);
      }
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int tetgenmesh::splittetrahedron(triface* splittet, int qflag, REAL *ccent, 
                                 int chkencflag)
{
  triface searchtet;
  face *paryseg;
  point newpt, *ppt;
  badface *bface;
  insertvertexflags ivf;
  int splitflag = 0;
  int i;



  REAL rv = 0.; // Insertion radius of 'newpt'.

  makepoint(&newpt, FREEVOLVERTEX);
  for (i = 0; i < 3; i++) newpt[i] = ccent[i];

  if (useinsertradius) {
    rv = distance(newpt, org(*splittet));
    setpointinsradius(newpt, rv);
  }

  // Locate the new point. Starting from an interior point 'q' of the
  //   splittet. We perform a walk from q to the 'newpt', stop walking
  //   either we hit a subface or enter OUTSIDE.
  searchtet = *splittet;
  ivf.iloc = (int) OUTSIDE;
  ivf.iloc = locate(newpt, &searchtet, 1); // 'chkencflag' = 1.

  if ((ivf.iloc == (int) OUTSIDE) || (ivf.iloc == (int) ENCSUBFACE)) {
    // The circumcenter 'c' is not visible from 'q' (the interior of the tet).
// iffalse
    if (b->verbose > 2) {
      printf("    New point %d is blocked by a polygon.\n", pointmark(newpt));
    }
// \fi
    pointdealloc(newpt);  // Do not insert this vertex.
    if (b->nobisect) return 0; // -Y option.
    // There must be a polygon that blocks the visibility.
    // Search a subpolygon that contains the proj(c).
    face searchsh;
    REAL prjpt[3];
    locateresult sloc = OUTSIDE;
    tspivot(searchtet, searchsh);
    ppt = (point *) &(searchsh.sh[3]);
    projpt2face(ccent, ppt[0], ppt[1], ppt[2], prjpt);
    // Locate proj(c) on polygon. 
    sloc = slocate(prjpt, &searchsh, 0, 0, 1);
    if ((sloc == ONEDGE) || (sloc == ONFACE)) {
      // Found a subface/edge containing proj(c).
      // Check if 'c' encoraches upon this subface.
      REAL fcent[3], r = 0;
      ppt = (point *) &(searchsh.sh[3]);
      if (checkfac4encroach(ppt[0], ppt[1], ppt[2], ccent, fcent, &r)) {
        // Encroached. Split this subface.
        splitflag = splitsubface(&searchsh, NULL, org(*splittet), qflag, 
                                 fcent, chkencflag | 2);
        if (splitflag) {
          // Some subfaces may need to be repaired.
          repairencfacs(chkencflag | 2);
        }
      } 
    }
    else if ((sloc == OUTSIDE) || (sloc == ENCSEGMENT)) {
      // Hit a segment. We should split it. 
      // To be done...
    } 
    if (splitflag) {
      // Queue the tet if it is still alive.
      if ((splittet->tet != NULL) && (splittet->tet[4] != NULL)) {
        enqueuetetrahedron(splittet);
      }
    }
    return splitflag;
  }



  // Use Bowyer-Watson algorithm. Preserve subsegments and subfaces;
  ivf.bowywat = 3;
  ivf.lawson = 2;
  ivf.rejflag = 3;  // Do check for encroached segments and subfaces.
  if (b->metric) {
    ivf.rejflag |= 4; // Reject it if it lies in some protecting balls.
  }
  ivf.chkencflag = chkencflag;
  ivf.sloc = ivf.sbowywat = 0; // No use.
  ivf.splitbdflag = 0; // No use.
  ivf.validflag = 1;
  ivf.respectbdflag = 1;
  ivf.assignmeshsize = b->metric;

  ivf.refineflag = 1;
  ivf.refinetet = *splittet;


  if (insertpoint(newpt, &searchtet, NULL, NULL, &ivf)) {
    // Vertex is inserted.
    st_volref_count++;
    if (steinerleft > 0) steinerleft--;
    if (flipstack != NULL) {
      flipconstraints fc;
      fc.chkencflag = chkencflag;
      fc.enqflag = 2;
      lawsonflip3d(&fc);
      unflipqueue->restart();
    }
    return 1;
  } else {
    // Point is not inserted.
    pointdealloc(newpt);
    // Check if there are encroached segments/subfaces.
    if (ivf.iloc == (int) ENCSEGMENT) {
      if (!b->nobisect || checkconstraints) {  
        // Select an encroached segment and split it.
        for (i = 0; i < encseglist->objects; i++) {
          paryseg = (face *) fastlookup(encseglist, i);
          if (splitsegment(paryseg, NULL, rv, org(*splittet), NULL, qflag, 
                           chkencflag | 3)) {
            splitflag = 1; // A point is inserted on a segment.
            break;
          }
        }
      } // if (!b->nobisect)
      encseglist->restart();
      if (splitflag) {
        // Some segments may need to be repaired.
        if (badsubsegs->items > 0) {
          repairencsegs(chkencflag | 3);
        }
        // Some subfaces may need to be repaired.
        if (badsubfacs->items > 0) {
          repairencfacs(chkencflag | 2);
        }
      }
    } else if (ivf.iloc == (int) ENCSUBFACE) {
      if (!b->nobisect || checkconstraints) {
        // Select an encroached subface and split it.
        for (i = 0; i < encshlist->objects; i++) {
          bface = (badface *) fastlookup(encshlist, i);
          if (splitsubface(&(bface->ss), NULL, org(*splittet), qflag, 
                           bface->cent, chkencflag | 2)){
            splitflag = 1; // A point is inserted on a subface or a segment.
            break;
          }
        }
      } // if (!b->nobisect)
      encshlist->restart();
      if (splitflag) {
        // Some subfaces may need to be repaired.
        if (badsubfacs->items > 0) {
          repairencfacs(chkencflag | 2);
        }
      }
    } else {
      if (ivf.iloc == (int) NEARVERTEX) {
        terminatetetgen(this, 2);
      }
    }
    if (splitflag) {
      // Queue the tet if it is still alive.
      if ((splittet->tet != NULL) && (splittet->tet[4] != NULL)) {
        enqueuetetrahedron(splittet);
      }
    }
    return splitflag;
  }
}